

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::stringifyDescriptorUpdateMethod_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,DescriptorUpdateMethod method)

{
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  DescriptorUpdateMethod method_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"with_template",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"with_push",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"with_push_template",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"N/A",&local_28);
    std::allocator<char>::~allocator(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringifyDescriptorUpdateMethod(DescriptorUpdateMethod method)
{
	switch (method)
	{
		case DESCRIPTOR_UPDATE_METHOD_NORMAL:
			return "";
			break;

		case DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE:
			return "with_template";
			break;

		case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH:
			return "with_push";
			break;

		case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE:
			return "with_push_template";
			break;

		default:
			return "N/A";
			break;
	}
}